

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * cuddAddGeneralVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vectorOn,DdNode **vectorOff,
                   int deepest)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *g;
  DdNode *f_00;
  DdNode *g_00;
  DdNode *value;
  
  iVar2 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    iVar2 = dd->perm[f->index];
  }
  pDVar3 = f;
  if ((iVar2 <= deepest) && (pDVar3 = cuddHashTableLookup1(table,f), pDVar3 == (DdNode *)0x0)) {
    pDVar3 = cuddAddGeneralVectorComposeRecur(dd,table,(f->type).kids.T,vectorOn,vectorOff,deepest);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      g = cuddAddGeneralVectorComposeRecur(dd,table,(f->type).kids.E,vectorOn,vectorOff,deepest);
      value = pDVar3;
      if (g != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        f_00 = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOn[f->index],pDVar3);
        if (f_00 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          value = g;
        }
        else {
          piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          g_00 = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOff[f->index],g);
          if (g_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,g);
            value = f_00;
          }
          else {
            piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            value = cuddAddApplyRecur(dd,Cudd_addPlus,f_00,g_00);
            if (value == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,g);
              Cudd_RecursiveDeref(dd,f_00);
              value = g_00;
            }
            else {
              piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,g);
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g_00);
              if (((ulong)f->ref == 1) ||
                 (iVar2 = cuddHashTableInsert1(table,f,value,(ulong)f->ref - 1), iVar2 != 0)) {
                piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + -1;
                return value;
              }
            }
          }
        }
      }
      Cudd_RecursiveDeref(dd,value);
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

static DdNode *
cuddAddGeneralVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* ADD in which to compose */,
  DdNode ** vectorOn /* functions to substitute for x_i */,
  DdNode ** vectorOff /* functions to substitute for x_i' */,
  int  deepest /* depth of deepest substitution */)
{
    DdNode      *T,*E,*t,*e;
    DdNode      *res;

    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,f->index) > deepest) {
        return(f);
    }

    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
#ifdef DD_DEBUG
        addGeneralVectorComposeHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddGeneralVectorComposeRecur(dd,table,cuddT(f),
                                         vectorOn,vectorOff,deepest);
    if (T == NULL)  return(NULL);
    cuddRef(T);
    E = cuddAddGeneralVectorComposeRecur(dd,table,cuddE(f),
                                         vectorOn,vectorOff,deepest);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Retrieve the compose ADDs for the current top variable and call
    ** cuddAddApplyRecur with the T and E we just created.
    */
    t = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOn[f->index],T);
    if (t == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      return(NULL);
    }
    cuddRef(t);
    e = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOff[f->index],E);
    if (e == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      Cudd_RecursiveDeref(dd,t);
      return(NULL);
    }
    cuddRef(e);
    res = cuddAddApplyRecur(dd,Cudd_addPlus,t,e);
    if (res == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      Cudd_RecursiveDeref(dd,t);
      Cudd_RecursiveDeref(dd,e);
      return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    Cudd_RecursiveDeref(dd,t);
    Cudd_RecursiveDeref(dd,e);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again
    */
    if (f->ref != 1) {
        ptrint fanout = (ptrint) f->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}